

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::FormatString<char[9],char[19],char[6],char[20],char[117]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [9],char (*Args_1) [19],
          char (*Args_2) [6],char (*Args_3) [20],char (*Args_4) [117])

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[9],char[19],char[6],char[20],char[117]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [9])this,(char (*) [19])Args,(char (*) [6])Args_1,(char (*) [20])Args_2,
             (char (*) [117])Args_3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}